

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * Strsafe(char *y)

{
  size_t sVar1;
  char *dest;
  char *cpy;
  char *z;
  char *y_local;
  
  if (y == (char *)0x0) {
    y_local = (char *)0x0;
  }
  else {
    cpy = Strsafe_find(y);
    if (cpy == (char *)0x0) {
      sVar1 = strlen(y);
      dest = (char *)malloc((long)((int)sVar1 + 1));
      if (dest != (char *)0x0) {
        lemon_strcpy(dest,y);
        Strsafe_insert(dest);
        cpy = dest;
      }
    }
    if (cpy == (char *)0x0) {
      memory_error();
    }
    y_local = cpy;
  }
  return y_local;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}